

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::CuriosityPart::Initialize
          (CuriosityPart *this,shared_ptr<chrono::ChBodyAuxRef> *chassis)

{
  element_type *peVar1;
  ChSystem *system;
  ChFrameMoving<double> *Fa;
  undefined1 local_a0 [8];
  ChFrame<double> X_GC;
  shared_ptr<chrono::ChBodyAuxRef> *chassis_local;
  CuriosityPart *this_local;
  
  X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (double)chassis;
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)chassis);
  system = ChPhysicsItem::GetSystem((ChPhysicsItem *)peVar1);
  Construct(this,system);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)chassis);
  Fa = (ChFrameMoving<double> *)(**(code **)(*(long *)peVar1 + 0x1f0))();
  chrono::operator*((ChFrame<double> *)local_a0,Fa,&this->m_pos);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_body);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs((ChFrame *)peVar1);
  ChFrame<double>::~ChFrame((ChFrame<double> *)local_a0);
  return;
}

Assistant:

void CuriosityPart::Initialize(std::shared_ptr<ChBodyAuxRef> chassis) {
    Construct(chassis->GetSystem());

    // Set absolute position
    ChFrame<> X_GC = chassis->GetFrame_REF_to_abs() * m_pos;
    m_body->SetFrame_REF_to_abs(X_GC);
}